

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_line.h
# Opt level: O3

void __thiscall
charls::process_transformed<charls::transform_hp1<unsigned_char>_>::encode_transform
          (process_transformed<charls::transform_hp1<unsigned_char>_> *this,void *source,
          void *destination,size_t pixel_count,size_t destination_stride)

{
  anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5 aVar1;
  byte bVar2;
  int iVar3;
  interleave_mode iVar4;
  uint32_t uVar5;
  byte bVar6;
  byte bVar7;
  size_t sVar8;
  anon_union_1_2_7f9ecb7a_for_triplet<unsigned_char>_5 *paVar9;
  
  if (this->parameters_->output_bgr == true) {
    memcpy((this->temp_line_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start,source,pixel_count * 3);
    source = (this->temp_line_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (pixel_count != 0) {
      iVar3 = this->frame_info_->component_count;
      paVar9 = &(((quad<unsigned_char> *)source)->super_triplet<unsigned_char>).field_2;
      sVar8 = pixel_count;
      do {
        aVar1 = paVar9[-2];
        paVar9[-2] = *paVar9;
        *paVar9 = aVar1;
        paVar9 = paVar9 + iVar3;
        sVar8 = sVar8 - 1;
      } while (sVar8 != 0);
      source = (this->temp_line_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
  }
  iVar3 = this->frame_info_->component_count;
  if (iVar3 == 4) {
    iVar4 = this->parameters_->interleave_mode;
    if (iVar4 == Line) {
      transform_quad_to_line<charls::transform_hp1<unsigned_char>,unsigned_char>
                ((quad<unsigned_char> *)source,pixel_count,(uchar *)destination,destination_stride,
                 (transform_hp1<unsigned_char> *)&this->field_0x50,this->mask_);
      return;
    }
    if (iVar4 == Sample) {
      transform_line<charls::transform_hp1<unsigned_char>,unsigned_char>
                ((quad<unsigned_char> *)destination,(quad<unsigned_char> *)source,pixel_count,
                 (transform_hp1<unsigned_char> *)&this->field_0x50,this->mask_);
      return;
    }
  }
  else if (iVar3 == 3) {
    if (this->parameters_->interleave_mode == Sample) {
      transform_line<charls::transform_hp1<unsigned_char>,unsigned_char>
                ((triplet<unsigned_char> *)destination,(triplet<unsigned_char> *)source,pixel_count,
                 (transform_hp1<unsigned_char> *)&this->field_0x50,this->mask_);
      return;
    }
    if (destination_stride <= pixel_count) {
      pixel_count = destination_stride;
    }
    if (pixel_count != 0) {
      uVar5 = this->mask_;
      paVar9 = &(((quad<unsigned_char> *)source)->super_triplet<unsigned_char>).field_2;
      sVar8 = 0;
      do {
        bVar7 = (byte)uVar5;
        bVar6 = ((anon_union_1_2_7f9ecc14_for_triplet<unsigned_char>_3 *)(paVar9 + -1))->v2 & bVar7;
        bVar2 = paVar9->v3;
        *(byte *)((long)destination + sVar8) =
             (((((triplet<unsigned_char> *)(paVar9 + -2))->field_0).v1 & bVar7) - bVar6) + -0x80;
        *(byte *)((long)destination + sVar8 + destination_stride) = bVar6;
        *(byte *)((long)destination + sVar8 + destination_stride * 2) =
             ((bVar2 & bVar7) - bVar6) + -0x80;
        sVar8 = sVar8 + 1;
        paVar9 = paVar9 + 3;
      } while (pixel_count != sVar8);
    }
  }
  return;
}

Assistant:

void encode_transform(const void* source, void* destination, const size_t pixel_count,
                          const size_t destination_stride) noexcept
    {
        if (parameters_.output_bgr)
        {
            memcpy(temp_line_.data(), source, sizeof(triplet<size_type>) * pixel_count);
            transform_rgb_to_bgr(temp_line_.data(), frame_info_.component_count, pixel_count);
            source = temp_line_.data();
        }

        if (frame_info_.component_count == 3)
        {
            if (parameters_.interleave_mode == interleave_mode::sample)
            {
                transform_line(static_cast<triplet<size_type>*>(destination), static_cast<const triplet<size_type>*>(source),
                               pixel_count, transform_, mask_);
            }
            else
            {
                transform_triplet_to_line(static_cast<const triplet<size_type>*>(source), pixel_count,
                                          static_cast<size_type*>(destination), destination_stride, transform_, mask_);
            }
        }
        else if (frame_info_.component_count == 4)
        {
            if (parameters_.interleave_mode == interleave_mode::sample)
            {
                transform_line(static_cast<quad<size_type>*>(destination), static_cast<const quad<size_type>*>(source),
                               pixel_count, transform_, mask_);
            }
            else if (parameters_.interleave_mode == interleave_mode::line)
            {
                transform_quad_to_line(static_cast<const quad<size_type>*>(source), pixel_count,
                                       static_cast<size_type*>(destination), destination_stride, transform_, mask_);
            }
        }
    }